

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.cpp
# Opt level: O1

void __thiscall Quest::Load(Quest *this)

{
  World *pWVar1;
  int iVar2;
  mapped_type *this_00;
  Quest *this_01;
  iterator iVar3;
  Validation_Error *pVVar4;
  runtime_error *this_02;
  _Rb_tree_node_base *__comp;
  Action *pAVar5;
  _Base_ptr p_Var6;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *info;
  long lVar7;
  _Base_ptr p_Var8;
  long *plVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  Action *pAVar11;
  _Base_ptr p_Var12;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>_>
  __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>_>
  __l_00;
  anon_class_16_2_f810ab82 check;
  string filename;
  char namebuf [6];
  Action action;
  ifstream f;
  _Rb_tree_node_base *local_a80;
  int local_a74 [21];
  Action *local_a20;
  anon_class_16_2_f810ab82 local_a18;
  undefined1 *local_a08;
  undefined1 *local_a00;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *local_9f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *local_9f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *local_9e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *local_9e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *local_9d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *local_9d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *local_9c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *local_9c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *local_9b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *local_9b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *local_9a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *local_9a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *local_998;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *local_990;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *local_988;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *local_980;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *local_978;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *local_970;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *local_968;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *local_960;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *local_958;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *local_950;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *local_948;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *local_940;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *local_938;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *local_930;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *local_928;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *local_920;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *local_918;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *local_910;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *local_908;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *local_900;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *local_8f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *local_8f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *local_8e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *local_8e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *local_8d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *local_8d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *local_8c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *local_8c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *local_8b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *local_8b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *local_8a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *local_8a0;
  _Rb_tree_node_base *local_898;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_890;
  info_t local_870;
  info_t local_868;
  info_t local_860;
  info_t local_858;
  _Rb_tree_node_base *local_850;
  undefined1 *local_848;
  undefined1 *local_840;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *local_838;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *local_830;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *local_828;
  key_type *local_820;
  string local_818;
  string local_7f8;
  string local_7d8;
  string local_7b8;
  string local_798;
  string local_778;
  string local_758;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *local_738;
  _Rb_tree_node_base *local_730;
  Quest *local_728;
  deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_> *local_720;
  char local_716 [6];
  undefined1 local_710 [40];
  undefined1 local_6e8 [32];
  info_t local_6c8;
  undefined1 local_6c0 [24];
  undefined1 local_6a8 [8];
  undefined1 local_6a0 [8];
  undefined1 local_698 [16];
  undefined1 local_688 [56];
  undefined1 local_650 [8];
  undefined1 local_648 [80];
  undefined1 local_5f8 [32];
  undefined1 local_5d8 [48];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  local_5a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  local_580;
  undefined1 local_558 [32];
  undefined1 local_538 [32];
  undefined1 local_518 [56];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  local_4e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  local_4b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  local_490;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  local_468;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  local_440;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  local_418;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  local_3f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  local_3c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  local_3a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  local_378;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  local_350;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  local_328;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  local_300;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  local_2d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  local_2b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  local_288;
  undefined4 *local_260;
  undefined8 local_258;
  undefined8 local_250;
  undefined8 local_240;
  long local_238 [4];
  byte abStack_218 [488];
  
  pWVar1 = this->world;
  local_710._0_8_ = local_710 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_710,"QuestDir","");
  this_00 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar1->config,(key_type *)local_710);
  util::variant::GetString_abi_cxx11_(&local_7b8,this_00);
  if ((undefined1 *)local_710._0_8_ != local_710 + 0x10) {
    operator_delete((void *)local_710._0_8_,local_710._16_8_ + 1);
  }
  sprintf(local_716,"%05i",(ulong)(uint)(int)this->id);
  std::__cxx11::string::append((char *)&local_7b8);
  std::__cxx11::string::append((char *)&local_7b8);
  std::ifstream::ifstream(local_238,(string *)&local_7b8,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
    this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_02,"Failed to load quest");
    __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_01 = (Quest *)operator_new(0x68);
  EOPlus::Quest::Quest(this_01,(istream *)local_238);
  this->quest = this_01;
  local_a80 = (this_01->states)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_730 = &(this_01->states)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_728 = this_01;
  if (local_a80 != local_730) {
    local_8a8 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
                 *)(local_688 + 0x18);
    local_8b8 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
                 *)(local_648 + 0x28);
    local_8c8 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
                 *)(local_5d8 + 8);
    local_8d8 = &local_5a8;
    local_8e8 = &local_580;
    local_8f8 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
                 *)(local_538 + 8);
    local_908 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
                 *)(local_518 + 0x10);
    local_8a0 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
                 *)(local_688 + 0x18);
    local_8b0 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
                 *)(local_648 + 0x28);
    local_8c0 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
                 *)(local_5d8 + 8);
    local_8d0 = &local_5a8;
    info = &local_580;
    local_8f0 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
                 *)(local_538 + 8);
    local_900 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
                 *)(local_518 + 0x10);
    local_918 = &local_4e0;
    local_910 = &local_4e0;
    local_928 = &local_4b8;
    local_920 = &local_4b8;
    local_938 = &local_490;
    local_930 = &local_490;
    local_948 = &local_468;
    local_940 = &local_468;
    local_958 = &local_440;
    local_950 = &local_440;
    local_968 = &local_418;
    local_960 = &local_418;
    local_978 = &local_3f0;
    local_970 = &local_3f0;
    local_990 = &local_3a0;
    local_988 = &local_3a0;
    local_9a0 = &local_378;
    local_998 = &local_378;
    local_9b0 = &local_350;
    local_9a8 = &local_350;
    local_9c0 = &local_328;
    local_9b8 = &local_328;
    local_9c8 = &local_300;
    local_828 = &local_300;
    local_9d0 = &local_2d8;
    local_980 = &local_2d8;
    local_9d8 = &local_2b0;
    local_738 = &local_2b0;
    local_9e0 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
                 *)local_5f8;
    local_9e8 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
                 *)local_5f8;
    local_820 = (key_type *)local_5f8;
    local_9f0 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
                 *)local_648;
    local_9f8 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
                 *)local_648;
    local_720 = (deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_> *)local_648;
    local_a00 = local_6c0;
    local_830 = &local_3c8;
    local_838 = &local_288;
    local_a08 = local_6e8;
    local_840 = local_6c0;
    local_848 = local_698;
    __comp = (_Rb_tree_node_base *)local_558;
    local_8e0 = info;
    local_850 = __comp;
    do {
      if ((validate_state(EOPlus::Quest_const&,std::__cxx11::string_const&,EOPlus::State_const&)::
           action_argument_info_abi_cxx11_ == '\0') &&
         (iVar2 = __cxa_guard_acquire(&validate_state(EOPlus::Quest_const&,std::__cxx11::string_const&,EOPlus::State_const&)
                                       ::action_argument_info_abi_cxx11_), iVar2 != 0)) {
        local_868.min_args = 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[9],_int,_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
                    *)local_710,(char (*) [9])"setstate",&local_868.min_args);
        local_6e8._0_8_ = local_6e8 + 0x10;
        local_6e8[0x14] = 't';
        local_6e8._16_4_ = 0x65736572;
        local_6e8._8_8_ = (_Elt_pointer)0x5;
        local_6e8[0x15] = '\0';
        local_6c8.min_args = 0;
        local_6c8.max_args = 0;
        local_870 = (info_t)((ulong)local_870 & 0xffffffff00000000);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[11],_int,_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
                    *)local_6c0,(char (*) [11])"resetdaily",&local_870.min_args);
        local_698._0_8_ = local_688;
        local_688[2] = 100;
        local_688._0_2_ = 0x6e65;
        local_698._8_8_ = (_Elt_pointer)0x3;
        local_688[3] = _S_red >> 0x18;
        local_688._16_4_ = 0;
        local_688._20_4_ = 0;
        local_890._M_dataplus._M_p = (pointer)0x200000001;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[11],_true>(local_8a8,(char (*) [11])"startquest",(info_t *)&local_890)
        ;
        local_a74[0x14] = 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[11],_int,_true>
                  (local_9f0,(char (*) [11])"resetquest",local_a74 + 0x14);
        local_a74[0x13] = 2;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[14],_int,_true>
                  (local_8b8,(char (*) [14])"setqueststate",local_a74 + 0x13);
        local_a74[0x12] = 2;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[11],_int,_true>
                  (local_9e0,(char (*) [11])"addnpctext",local_a74 + 0x12);
        local_a74[0x11] = 3;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[12],_int,_true>
                  (local_8c8,(char (*) [12])"addnpcinput",local_a74 + 0x11);
        local_a74[0x10] = 2;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[11],_int,_true>
                  (local_8d8,(char (*) [11])"addnpcchat",local_a74 + 0x10);
        local_a74[0xf] = 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[9],_int,_true>(local_8e8,(char (*) [9])"showhint",local_a74 + 0xf);
        local_558._0_8_ = local_558 + 0x10;
        local_558[0x14] = 'e';
        local_558._16_4_ = 0x6b617571;
        local_558._8_8_ = (_Elt_pointer)0x5;
        local_558[0x15] = '\0';
        local_538._0_4_ = 0;
        local_538._4_4_ = 1;
        local_a18.name = (string *)0x100000000;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[11],_true>(local_8f8,(char (*) [11])"quakeworld",(info_t *)&local_a18)
        ;
        local_a74[0xe] = 3;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[7],_int,_true>(local_908,(char (*) [7])"setmap",local_a74 + 0xe);
        local_a74[0xd] = 3;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[9],_int,_true>(local_918,(char (*) [9])"setcoord",local_a74 + 0xd);
        local_a74[0xc] = 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[10],_int,_true>(local_928,(char (*) [10])"playsound",local_a74 + 0xc);
        local_a74[0xb] = 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[8],_int,_true>(local_938,(char (*) [8])"giveexp",local_a74 + 0xb);
        local_858.min_args = 1;
        local_858.max_args = 2;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[9],_true>(local_948,(char (*) [9])"giveitem",&local_858);
        local_860.min_args = 1;
        local_860.max_args = 2;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[11],_true>(local_958,(char (*) [11])"removeitem",&local_860);
        local_a74[10] = 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[9],_int,_true>(local_968,(char (*) [9])"setclass",local_a74 + 10);
        local_a74[9] = 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[8],_int,_true>(local_978,(char (*) [8])"setrace",local_a74 + 9);
        local_a74[8] = 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[12],_int,_true>(&local_3c8,(char (*) [12])"removekarma",local_a74 + 8)
        ;
        local_a74[7] = 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[10],_int,_true>(local_990,(char (*) [10])"givekarma",local_a74 + 7);
        local_a74[6] = 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[9],_int,_true>(local_9a0,(char (*) [9])"settitle",local_a74 + 6);
        local_a74[5] = 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[10],_int,_true>(local_9b0,(char (*) [10])"setfiance",local_a74 + 5);
        local_a74[4] = 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[11],_int,_true>(local_9c0,(char (*) [11])"setpartner",local_a74 + 4);
        local_a74[3] = 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[8],_int,_true>(local_9c8,(char (*) [8])"sethome",local_a74 + 3);
        local_a74[2] = 2;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[8],_int,_true>(local_9d0,(char (*) [8])"setstat",local_a74 + 2);
        local_a74[1] = 2;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[9],_int,_true>(local_9d8,(char (*) [9])"givestat",local_a74 + 1);
        local_a74[0] = 2;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[11],_int,_true>(&local_288,(char (*) [11])"removestat",local_a74);
        local_260 = (undefined4 *)&local_250;
        local_250._0_4_ = 0x6c6c6f72;
        local_258 = 4;
        local_250._4_1_ = 0;
        local_240 = 0x100000001;
        __l._M_len = 0x1f;
        __l._M_array = (iterator)local_710;
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>_>_>
               *)validate_state(EOPlus::Quest_const&,std::__cxx11::string_const&,EOPlus::State_const&)
                 ::action_argument_info_abi_cxx11_,__l,
              (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)__comp,(allocator_type *)info);
        lVar7 = -0x4d8;
        plVar9 = &local_250;
        do {
          if (plVar9 != (long *)plVar9[-2]) {
            operator_delete((long *)plVar9[-2],*plVar9 + 1);
          }
          plVar9 = plVar9 + -5;
          lVar7 = lVar7 + 0x28;
        } while (lVar7 != 0);
        __cxa_atexit(std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>_>_>
                     ::~map,validate_state(EOPlus::Quest_const&,std::__cxx11::string_const&,EOPlus::State_const&)
                            ::action_argument_info_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&validate_state(EOPlus::Quest_const&,std::__cxx11::string_const&,EOPlus::State_const&)
                             ::action_argument_info_abi_cxx11_);
      }
      if ((validate_state(EOPlus::Quest_const&,std::__cxx11::string_const&,EOPlus::State_const&)::
           rule_argument_info_abi_cxx11_ == '\0') &&
         (iVar2 = __cxa_guard_acquire(&validate_state(EOPlus::Quest_const&,std::__cxx11::string_const&,EOPlus::State_const&)
                                       ::rule_argument_info_abi_cxx11_), iVar2 != 0)) {
        local_a74[0x14] = 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[9],_int,_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
                    *)local_710,(char (*) [9])"inputnpc",local_a74 + 0x14);
        local_a74[0x13] = 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[12],_int,_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
                    *)local_6e8,(char (*) [12])"talkedtonpc",local_a74 + 0x13);
        local_a74[0x12] = 0;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[7],_int,_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
                    *)local_6c0,(char (*) [7])"always",local_a74 + 0x12);
        local_a74[0x11] = 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[10],_int,_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
                    *)local_698,(char (*) [10])"donedaily",local_a74 + 0x11);
        local_a74[0x10] = 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[9],_int,_true>(local_8a0,(char (*) [9])"entermap",local_a74 + 0x10);
        local_a74[0xf] = 3;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[11],_int,_true>(local_9f8,(char (*) [11])"entercoord",local_a74 + 0xf)
        ;
        local_a74[0xe] = 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[9],_int,_true>(local_8b0,(char (*) [9])"leavemap",local_a74 + 0xe);
        local_a74[0xd] = 3;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[11],_int,_true>(local_9e8,(char (*) [11])"leavecoord",local_a74 + 0xd)
        ;
        local_890._M_dataplus._M_p = (pointer)0x200000001;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[11],_true>(local_8c0,(char (*) [11])"killednpcs",(info_t *)&local_890)
        ;
        local_a74[0xc] = 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[14],_int,_true>
                  (local_8d0,(char (*) [14])"killedplayers",local_a74 + 0xc);
        local_a18.name = (string *)0x200000001;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[9],_true>(local_8e0,(char (*) [9])"gotitems",(info_t *)&local_a18);
        local_858.min_args = 1;
        local_858.max_args = 2;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[10],_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
                    *)local_558,(char (*) [10])"lostitems",&local_858);
        local_860.min_args = 1;
        local_860.max_args = 2;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[9],_true>(local_8f0,(char (*) [9])"useditem",&local_860);
        local_a74[0xb] = 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[9],_int,_true>(local_900,(char (*) [9])"isgender",local_a74 + 0xb);
        local_a74[10] = 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[8],_int,_true>(local_910,(char (*) [8])"isclass",local_a74 + 10);
        local_a74[9] = 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[7],_int,_true>(local_920,(char (*) [7])"israce",local_a74 + 9);
        local_a74[8] = 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[10],_int,_true>(local_930,(char (*) [10])"iswearing",local_a74 + 8);
        local_868.min_args = 1;
        local_868.max_args = 2;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[9],_true>(local_940,(char (*) [9])"gotspell",&local_868);
        local_a74[7] = 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[10],_int,_true>(local_950,(char (*) [10])"lostspell",local_a74 + 7);
        local_870.min_args = 1;
        local_870.max_args = 2;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[10],_true>(local_960,(char (*) [10])"usedspell",&local_870);
        local_a74[6] = 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[10],_int,_true>(local_970,(char (*) [10])"citizenof",local_a74 + 6);
        local_3c8.first._M_dataplus._M_p = (pointer)&local_3c8.first.field_2;
        local_3c8.first.field_2._M_allocated_capacity._4_2_ = 0x6465;
        local_3c8.first.field_2._M_allocated_capacity._0_4_ = 0x6c6c6f72;
        local_3c8.first._M_string_length = 6;
        local_3c8.first.field_2._M_local_buf[6] = '\0';
        local_3c8.second.min_args = 1;
        local_3c8.second.max_args = 2;
        local_a74[5] = 2;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[7],_int,_true>(local_988,(char (*) [7])"statis",local_a74 + 5);
        local_a74[4] = 2;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[8],_int,_true>(local_998,(char (*) [8])"statnot",local_a74 + 4);
        local_a74[3] = 2;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[12],_int,_true>(local_9a8,(char (*) [12])"statgreater",local_a74 + 3);
        local_a74[2] = 2;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[9],_int,_true>(local_9b8,(char (*) [9])"statless",local_a74 + 2);
        local_a74[1] = 3;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[12],_int,_true>(local_828,(char (*) [12])"statbetween",local_a74 + 1);
        local_a74[0] = 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[8],_int,_true>(local_980,(char (*) [8])"statrpn",local_a74);
        __l_00._M_len = 0x1c;
        __l_00._M_array = (iterator)local_710;
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>_>_>
               *)validate_state(EOPlus::Quest_const&,std::__cxx11::string_const&,EOPlus::State_const&)
                 ::rule_argument_info_abi_cxx11_,__l_00,
              (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)__comp,(allocator_type *)info);
        lVar7 = -0x460;
        paVar10 = &local_2d8.first.field_2;
        do {
          if (paVar10 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(&paVar10->_M_allocated_capacity)[-2]) {
            operator_delete((long *)(&paVar10->_M_allocated_capacity)[-2],
                            paVar10->_M_allocated_capacity + 1);
          }
          paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(&paVar10->_M_allocated_capacity + -5);
          lVar7 = lVar7 + 0x28;
        } while (lVar7 != 0);
        __cxa_atexit(std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>_>_>
                     ::~map,validate_state(EOPlus::Quest_const&,std::__cxx11::string_const&,EOPlus::State_const&)
                            ::rule_argument_info_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&validate_state(EOPlus::Quest_const&,std::__cxx11::string_const&,EOPlus::State_const&)
                             ::rule_argument_info_abi_cxx11_);
      }
      local_a18.name = (string *)(local_a80 + 1);
      local_a18.quest = local_728;
      pAVar11 = (Action *)local_a80[7]._M_parent;
      local_a20 = (Action *)local_a80[8]._M_parent;
      __comp = local_a80;
      local_898 = (_Rb_tree_node_base *)local_a18.name;
      if (pAVar11 != local_a20) {
        pAVar5 = (Action *)local_a80[7]._M_right;
        lVar7 = *(long *)(local_a80 + 8);
        do {
          EOPlus::Action::Action((Action *)local_710,pAVar11);
          iVar3 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>_>_>
                  ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>_>_>
                          *)validate_state(EOPlus::Quest_const&,std::__cxx11::string_const&,EOPlus::State_const&)
                            ::action_argument_info_abi_cxx11_,local_820);
          if (iVar3._M_node ==
              (_Base_ptr)
              (validate_state(EOPlus::Quest_const&,std::__cxx11::string_const&,EOPlus::State_const&)
               ::action_argument_info_abi_cxx11_ + 8)) {
            pVVar4 = (Validation_Error *)__cxa_allocate_exception(0x30);
            std::operator+(&local_890,"Unknown action: ",local_820);
            Validation_Error::Validation_Error(pVVar4,&local_890,(string *)local_898);
            __cxa_throw(pVVar4,&Validation_Error::typeinfo,Validation_Error::~Validation_Error);
          }
          local_7d8._M_dataplus._M_p = (pointer)&local_7d8.field_2;
          local_7d8.field_2._M_allocated_capacity._4_2_ = 0x6e6f;
          local_7d8.field_2._M_allocated_capacity._0_4_ = 0x69746341;
          local_7d8._M_string_length = 6;
          local_7d8.field_2._M_local_buf[6] = '\0';
          local_758._M_dataplus._M_p = (pointer)&local_758.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_758,local_5f8._0_8_,
                     (pointer)(local_5f8._0_8_ + local_5f8._8_8_));
          info = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
                  *)(iVar3._M_node + 2);
          __comp = (_Rb_tree_node_base *)local_5d8;
          validate_state::anon_class_16_2_f810ab82::operator()
                    (&local_a18,&local_7d8,&local_758,
                     (deque<util::variant,_std::allocator<util::variant>_> *)__comp,(info_t *)info);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_758._M_dataplus._M_p != &local_758.field_2) {
            operator_delete(local_758._M_dataplus._M_p,local_758.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
            operator_delete(local_7d8._M_dataplus._M_p,
                            CONCAT17(local_7d8.field_2._M_local_buf[7],
                                     CONCAT16(local_7d8.field_2._M_local_buf[6],
                                              CONCAT24(local_7d8.field_2._M_allocated_capacity._4_2_
                                                       ,local_7d8.field_2._M_allocated_capacity.
                                                        _0_4_))) + 1);
          }
          std::deque<util::variant,_std::allocator<util::variant>_>::~deque
                    ((deque<util::variant,_std::allocator<util::variant>_> *)local_5d8);
          if ((undefined1 *)local_5f8._0_8_ != local_5f8 + 0x10) {
            operator_delete((void *)local_5f8._0_8_,local_5f8._16_8_ + 1);
          }
          std::deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>::~deque(local_720);
          std::deque<util::variant,_std::allocator<util::variant>_>::~deque
                    ((deque<util::variant,_std::allocator<util::variant>_> *)local_698);
          if ((undefined1 *)local_6c0._8_8_ != local_6c0 + 0x18) {
            operator_delete((void *)local_6c0._8_8_,(long)local_6a8 + 1);
          }
          std::deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>::~deque
                    ((deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_> *)(local_710 + 8));
          pAVar11 = pAVar11 + 1;
          if (pAVar11 == pAVar5) {
            pAVar11 = *(Action **)(lVar7 + 8);
            lVar7 = lVar7 + 8;
            pAVar5 = pAVar11 + 1;
          }
        } while (pAVar11 != local_a20);
      }
      p_Var12 = local_a80[4]._M_right;
      local_a20 = (Action *)local_a80[5]._M_right;
      if ((Action *)p_Var12 != local_a20) {
        p_Var6 = local_a80[5]._M_parent;
        p_Var8 = local_a80[5]._M_left;
        do {
          std::deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>::deque
                    ((deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_> *)local_710,
                     (deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_> *)p_Var12);
          local_6c0._0_8_ = local_6c0 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_6c0,p_Var12[2]._M_left,
                     (long)&(p_Var12[2]._M_left)->_M_color + (long)&(p_Var12[2]._M_right)->_M_color)
          ;
          std::deque<util::variant,_std::allocator<util::variant>_>::deque
                    ((deque<util::variant,_std::allocator<util::variant>_> *)local_6a0,
                     (deque<util::variant,_std::allocator<util::variant>_> *)&p_Var12[3]._M_left);
          EOPlus::Action::Action((Action *)local_650,(Action *)(p_Var12 + 6));
          iVar3 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>_>_>
                  ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>_>_>
                          *)validate_state(EOPlus::Quest_const&,std::__cxx11::string_const&,EOPlus::State_const&)
                            ::action_argument_info_abi_cxx11_,(key_type *)local_538);
          if (iVar3._M_node ==
              (_Base_ptr)
              (validate_state(EOPlus::Quest_const&,std::__cxx11::string_const&,EOPlus::State_const&)
               ::action_argument_info_abi_cxx11_ + 8)) {
            pVVar4 = (Validation_Error *)__cxa_allocate_exception(0x30);
            std::operator+(&local_890,"Unknown action: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_538);
            Validation_Error::Validation_Error(pVVar4,&local_890,(string *)local_898);
            __cxa_throw(pVVar4,&Validation_Error::typeinfo,Validation_Error::~Validation_Error);
          }
          local_7f8._M_dataplus._M_p = (pointer)&local_7f8.field_2;
          local_7f8.field_2._M_allocated_capacity._4_2_ = 0x6e6f;
          local_7f8.field_2._M_allocated_capacity._0_4_ = 0x69746341;
          local_7f8._M_string_length = 6;
          local_7f8.field_2._M_local_buf[6] = '\0';
          local_778._M_dataplus._M_p = (pointer)&local_778.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_778,local_538._0_8_,
                     (pointer)(local_538._8_8_ + local_538._0_8_));
          info = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
                  *)(iVar3._M_node + 2);
          __comp = (_Rb_tree_node_base *)local_518;
          validate_state::anon_class_16_2_f810ab82::operator()
                    (&local_a18,&local_7f8,&local_778,
                     (deque<util::variant,_std::allocator<util::variant>_> *)__comp,(info_t *)info);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_778._M_dataplus._M_p != &local_778.field_2) {
            operator_delete(local_778._M_dataplus._M_p,local_778.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
            operator_delete(local_7f8._M_dataplus._M_p,
                            CONCAT17(local_7f8.field_2._M_local_buf[7],
                                     CONCAT16(local_7f8.field_2._M_local_buf[6],
                                              CONCAT24(local_7f8.field_2._M_allocated_capacity._4_2_
                                                       ,local_7f8.field_2._M_allocated_capacity.
                                                        _0_4_))) + 1);
          }
          EOPlus::Rule::~Rule((Rule *)local_710);
          p_Var12 = (_Base_ptr)&p_Var12[0x12]._M_parent;
          if (p_Var12 == p_Var6) {
            p_Var12 = p_Var8->_M_parent;
            p_Var8 = (_Base_ptr)&p_Var8->_M_parent;
            p_Var6 = (_Base_ptr)&p_Var12[0x12]._M_parent;
          }
        } while ((Action *)p_Var12 != local_a20);
      }
      p_Var12 = local_a80[4]._M_right;
      local_a20 = (Action *)local_a80[5]._M_right;
      if ((Action *)p_Var12 != local_a20) {
        p_Var6 = local_a80[5]._M_parent;
        p_Var8 = local_a80[5]._M_left;
        do {
          std::deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>::deque
                    ((deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_> *)local_710,
                     (deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_> *)p_Var12);
          local_6c0._0_8_ = local_6c0 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_6c0,p_Var12[2]._M_left,
                     (long)&(p_Var12[2]._M_left)->_M_color + (long)&(p_Var12[2]._M_right)->_M_color)
          ;
          std::deque<util::variant,_std::allocator<util::variant>_>::deque
                    ((deque<util::variant,_std::allocator<util::variant>_> *)local_6a0,
                     (deque<util::variant,_std::allocator<util::variant>_> *)&p_Var12[3]._M_left);
          EOPlus::Action::Action((Action *)local_650,(Action *)(p_Var12 + 6));
          iVar3 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>_>_>
                  ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>_>_>
                          *)validate_state(EOPlus::Quest_const&,std::__cxx11::string_const&,EOPlus::State_const&)
                            ::rule_argument_info_abi_cxx11_,(key_type *)local_6c0);
          if (iVar3._M_node ==
              (_Base_ptr)
              (validate_state(EOPlus::Quest_const&,std::__cxx11::string_const&,EOPlus::State_const&)
               ::rule_argument_info_abi_cxx11_ + 8)) {
            pVVar4 = (Validation_Error *)__cxa_allocate_exception(0x30);
            std::operator+(&local_890,"Unknown rule: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_6c0);
            Validation_Error::Validation_Error(pVVar4,&local_890,(string *)local_898);
            __cxa_throw(pVVar4,&Validation_Error::typeinfo,Validation_Error::~Validation_Error);
          }
          local_818._M_dataplus._M_p = (pointer)&local_818.field_2;
          local_818.field_2._M_allocated_capacity._0_4_ = 0x656c7552;
          local_818._M_string_length = 4;
          local_818.field_2._M_allocated_capacity._4_4_ =
               local_818.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
          local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_798,local_6c0._0_8_,
                     (pointer)(local_6c0._8_8_ + local_6c0._0_8_));
          info = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
                  *)(iVar3._M_node + 2);
          __comp = (_Rb_tree_node_base *)local_6a0;
          validate_state::anon_class_16_2_f810ab82::operator()
                    (&local_a18,&local_818,&local_798,
                     (deque<util::variant,_std::allocator<util::variant>_> *)__comp,(info_t *)info);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_798._M_dataplus._M_p != &local_798.field_2) {
            operator_delete(local_798._M_dataplus._M_p,local_798.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_818._M_dataplus._M_p != &local_818.field_2) {
            operator_delete(local_818._M_dataplus._M_p,
                            CONCAT44(local_818.field_2._M_allocated_capacity._4_4_,
                                     local_818.field_2._M_allocated_capacity._0_4_) + 1);
          }
          EOPlus::Rule::~Rule((Rule *)local_710);
          p_Var12 = (_Base_ptr)&p_Var12[0x12]._M_parent;
          if (p_Var12 == p_Var6) {
            p_Var12 = p_Var8->_M_parent;
            p_Var8 = (_Base_ptr)&p_Var8->_M_parent;
            p_Var6 = (_Base_ptr)&p_Var12[0x12]._M_parent;
          }
        } while ((Action *)p_Var12 != local_a20);
      }
      local_a80 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_a80);
    } while (local_a80 != local_730);
  }
  std::ifstream::~ifstream(local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8._M_dataplus._M_p != &local_7b8.field_2) {
    operator_delete(local_7b8._M_dataplus._M_p,local_7b8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Quest::Load()
{
	char namebuf[6];

	std::string filename = this->world->config["QuestDir"];
	std::sprintf(namebuf, "%05i", this->id);
	filename += namebuf;
	filename += ".eqf";

	std::ifstream f(filename);

	if (!f)
		throw std::runtime_error("Failed to load quest");

	try
	{
		this->quest = new EOPlus::Quest(f);
		validate_quest(*this->quest);
	}
	catch (EOPlus::Syntax_Error& e)
	{
		Console::Err("Could not load quest: %s", filename.c_str());
		Console::Err("Syntax Error: %s (Line %i)", e.what(), e.line());
		throw;
	}
	catch (Validation_Error& e)
	{
		Console::Err("Could not load quest: %s", filename.c_str());
		Console::Err("Validation Error: %s (State: %s)", e.what(), e.state().c_str());
		throw;
	}
	catch (...)
	{
		Console::Err("Could not load quest: %s", filename.c_str());
		throw;
	}
}